

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

String * kj::_::operator*(String *__return_storage_ptr__,undefined8 *param_2,undefined8 param_3,
                         undefined8 param_4,String *param_5)

{
  char *pcVar1;
  size_t sVar2;
  String local_58;
  String local_38;
  
  capnp::_::enumString
            (&local_38,*(uint16_t *)*param_2,
             (RawBrandedSchema *)(capnp::schemas::s_9c8e9318b29d9cd3 + 0x48));
  capnp::_::enumString
            (&local_58,*(uint16_t *)param_2[1],
             (RawBrandedSchema *)(capnp::schemas::s_9c8e9318b29d9cd3 + 0x48));
  concat<kj::String,kj::StringPtr&,kj::String>
            (__return_storage_ptr__,(_ *)&local_38,(String *)(param_2 + 2),(StringPtr *)&local_58,
             param_5);
  sVar2 = local_58.content.size_;
  pcVar1 = local_58.content.ptr;
  if (local_58.content.ptr != (char *)0x0) {
    local_58.content.ptr = (char *)0x0;
    local_58.content.size_ = 0;
    (**(local_58.content.disposer)->_vptr_ArrayDisposer)
              (local_58.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  sVar2 = local_38.content.size_;
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}